

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O3

int AF_A_WraithMelee(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  AActor *this;
  VMValue *pVVar7;
  char *__assertion;
  AActor *target;
  bool bVar8;
  bool bVar9;
  FName local_34;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ec1bb;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005ec1ab;
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_005ec051;
    pPVar6 = (this->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar8 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar8;
    bVar9 = pPVar6 == pPVar3;
    if (!bVar9 && !bVar8) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
    uVar5 = (uint)bVar8;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005ec1bb;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_005ec1ab;
LAB_005ec051:
    this = (AActor *)0x0;
    pVVar7 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005ec1ab:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005ec1bb;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar6 = (PClass *)puVar2[1];
          if (pPVar6 == (PClass *)0x0) {
            pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar5,ret);
            puVar2[1] = pPVar6;
          }
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar3 && bVar8) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar8 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar3) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar8) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005ec1bb;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005ec1ab;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005ec1bb:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                    ,0x5b,"int AF_A_WraithMelee(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  bVar8 = AActor::CheckMeleeRange(this);
  if (!bVar8) {
    return 0;
  }
  uVar5 = FRandom::GenRand32(&pr_stealhealth);
  if (0xdb < (uVar5 & 0xfc)) {
    return 0;
  }
  uVar5 = FRandom::GenRand32(&pr_stealhealth);
  iVar4 = (uVar5 & 7) * 2 + 2;
  target = (this->target).field_0.p;
  if (target != (AActor *)0x0) {
    if (((target->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005ec16a;
    (this->target).field_0.p = (AActor *)0x0;
  }
  target = (AActor *)0x0;
LAB_005ec16a:
  local_34.Index = 0x84;
  local_30.Degrees = 0.0;
  P_DamageMobj(target,this,this,iVar4,&local_34,0,&local_30);
  this->health = this->health + iVar4;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithMelee)
{
	PARAM_ACTION_PROLOGUE;

	int amount;

	// Steal health from target and give to self
	if (self->CheckMeleeRange() && (pr_stealhealth()<220))
	{
		amount = pr_stealhealth.HitDice (2);
		P_DamageMobj (self->target, self, self, amount, NAME_Melee);
		self->health += amount;
	}
	return 0;
}